

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.h
# Opt level: O1

void __thiscall bidirectional::Search::replaceBestLabel(Search *this,int *lemon_id,Label *label)

{
  int iVar1;
  pointer psVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<labelling::Label> label_ptr;
  undefined1 local_29;
  Label *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_28 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<labelling::Label,std::allocator<labelling::Label>,labelling::Label_const&>
            (&local_20,&local_28,(allocator<labelling::Label> *)&local_29,label);
  iVar1 = *lemon_id;
  psVar2 = (this->best_labels).
           super__Vector_base<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar3 = psVar2[iVar1].super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar2[iVar1].super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_28;
  this_00 = psVar2[iVar1].super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  psVar2[iVar1].super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_20._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_28 = peVar3;
    local_20._M_pi = this_00;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void replaceBestLabel(const int& lemon_id, const labelling::Label& label) {
    auto label_ptr = std::make_shared<labelling::Label>(label);
    best_labels[lemon_id].swap(label_ptr);
  }